

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     outs<unsigned_char,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,uint16_t port,
               unsigned_short *eSI,Context *context)

{
  bool bVar1;
  Source segment;
  type_conflict value;
  unsigned_short uVar2;
  Context *context_local;
  unsigned_short *eSI_local;
  uint16_t port_local;
  unsigned_short *eCX_local;
  Instruction<false> *instruction_local;
  
  bVar1 = repetition_over<unsigned_short,(InstructionSet::x86::Repetition)0>(eCX);
  if (!bVar1) {
    segment = Instruction<false>::data_segment(instruction);
    value = PCCompatible::Memory::access<unsigned_char,(InstructionSet::x86::AccessType)0>
                      (&context->memory,segment,*eSI);
    PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::out<unsigned_char>
              (&context->io,port,value);
    uVar2 = Flags::direction<unsigned_short>(&context->flags);
    *eSI = *eSI + uVar2;
    repeat<unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (eCX,context);
  }
  return;
}

Assistant:

void outs(
	const InstructionT &instruction,
	AddressT &eCX,
	uint16_t port,
	AddressT &eSI,
	ContextT &context
) {
	if(repetition_over<AddressT, repetition>(eCX)) {
		return;
	}

	context.io.template out<IntT>(
		port,
		context.memory.template access<IntT, AccessType::Read>(instruction.data_segment(), eSI)
	);
	eSI += context.flags.template direction<AddressT>() * sizeof(IntT);

	repeat<AddressT, repetition>(eCX, context);
}